

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void __thiscall TestCase::~TestCase(TestCase *this)

{
  code *pcVar1;
  TestCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~TestCase() 
	{
	}